

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestStackRealloc.cpp
# Opt level: O0

void __thiscall TestEval::Run(TestEval *this)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  int local_24;
  int t;
  double evalStart;
  char *testEval;
  TestEval *this_local;
  
  nullcTerminate();
  nullcInit();
  nullcAddImportPath("Modules/");
  nullcAddImportPath("../Modules/");
  nullcSetFileReadHandler(Tests::fileLoadFunc,Tests::fileFreeFunc);
  nullcSetEnableLogFiles
            ((uint)(Tests::enableLogFiles & 1),(_func_void_ptr_char_ptr *)Tests::openStreamFunc,
             (_func_void_void_ptr_char_ptr_uint *)Tests::writeStreamFunc,
             (_func_void_void_ptr *)Tests::closeStreamFunc);
  nullcSetEnableTimeTrace((uint)(Tests::enableTimeTrace & 1));
  nullcInitDynamicModule();
  dVar2 = myGetPreciseTime();
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    if ((*(byte *)((long)&Tests::testExecutor + (long)local_24) & 1) != 0) {
      testsCount[local_24] = testsCount[local_24] + 1;
      bVar1 = Tests::RunCodeSimple
                        ("import std.dynamic;\r\n\r\nint a = 5;\r\n\r\nfor(int i = 0; i < 200; i++)\r\n\teval(\"a += 3 * \" + i.str() + \";\");\r\n\r\nreturn a;"
                         ,testTarget[local_24],"59705","Dynamic code. eval() [skip_c]",false,"");
      if (bVar1) {
        testsPassed[local_24] = testsPassed[local_24] + 1;
      }
      dVar3 = myGetPreciseTime();
      printf("Eval test finished in %f\n",dVar3 - dVar2);
    }
  }
  nullcTerminate();
  nullcInit();
  nullcAddImportPath("Modules/");
  nullcAddImportPath("../Modules/");
  nullcSetFileReadHandler(Tests::fileLoadFunc,Tests::fileFreeFunc);
  nullcSetEnableLogFiles
            ((uint)(Tests::enableLogFiles & 1),(_func_void_ptr_char_ptr *)Tests::openStreamFunc,
             (_func_void_void_ptr_char_ptr_uint *)Tests::writeStreamFunc,
             (_func_void_void_ptr *)Tests::closeStreamFunc);
  nullcSetEnableTimeTrace((uint)(Tests::enableTimeTrace & 1));
  nullcInitDynamicModule();
  return;
}

Assistant:

virtual void Run()
	{
		nullcTerminate();
		nullcInit();
		nullcAddImportPath(MODULE_PATH_A);
		nullcAddImportPath(MODULE_PATH_B);
		nullcSetFileReadHandler(Tests::fileLoadFunc, Tests::fileFreeFunc);
		nullcSetEnableLogFiles(Tests::enableLogFiles, Tests::openStreamFunc, Tests::writeStreamFunc, Tests::closeStreamFunc);
		nullcSetEnableTimeTrace(Tests::enableTimeTrace);
		nullcInitDynamicModule();

		const char	*testEval =
"import std.dynamic;\r\n\
\r\n\
int a = 5;\r\n\
\r\n\
for(int i = 0; i < 200; i++)\r\n\
	eval(\"a += 3 * \" + i.str() + \";\");\r\n\
\r\n\
return a;";
		double evalStart = myGetPreciseTime();
		for(int t = 0; t < TEST_TARGET_COUNT; t++)
		{
			if(!Tests::testExecutor[t])
				continue;
			testsCount[t]++;
			if(Tests::RunCodeSimple(testEval, testTarget[t], "59705", "Dynamic code. eval() [skip_c]", false, ""))
				testsPassed[t]++;
			printf("Eval test finished in %f\n", myGetPreciseTime() - evalStart);
		}
		nullcTerminate();
		nullcInit();
		nullcAddImportPath(MODULE_PATH_A);
		nullcAddImportPath(MODULE_PATH_B);
		nullcSetFileReadHandler(Tests::fileLoadFunc, Tests::fileFreeFunc);
		nullcSetEnableLogFiles(Tests::enableLogFiles, Tests::openStreamFunc, Tests::writeStreamFunc, Tests::closeStreamFunc);
		nullcSetEnableTimeTrace(Tests::enableTimeTrace);
		nullcInitDynamicModule();
	}